

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void anon_unknown.dwarf_1efa1d1::checkForInvalidNestedConfigNodes
               (ASTContext *context,InstanceOverride *node,ConfigBlockSymbol *configBlock)

{
  ConfigRule *pCVar1;
  uint uVar2;
  ushort uVar3;
  Diagnostic *this;
  char_pointer puVar4;
  char_pointer puVar5;
  char_pointer puVar6;
  table_element_pointer ppVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  SourceRange sourceRange;
  iterator iVar10;
  
  pCVar1 = node->rule;
  if (pCVar1 != (ConfigRule *)0x0) {
    pCVar1->isUsed = true;
    sourceRange = slang::syntax::SyntaxNode::sourceRange((pCVar1->syntax).ptr);
    this = slang::ast::ASTContext::addDiag(context,(DiagCode)0x1a0006,sourceRange);
    if (configBlock->resolved == false) {
      slang::ast::ConfigBlockSymbol::resolve(configBlock);
    }
    slang::Diagnostic::addNote(this,(DiagCode)0x40001,((configBlock->topCells)._M_ptr)->sourceRange)
    ;
  }
  iVar10 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    *)node);
  if (iVar10.p_ == (table_element_pointer)0x0) {
    return;
  }
LAB_00165c51:
  do {
    checkForInvalidNestedConfigNodes(context,&(iVar10.p_)->second,configBlock);
    puVar5 = iVar10.pc_ + 0x12;
    puVar6 = iVar10.pc_ + 2;
    while( true ) {
      puVar4 = puVar6;
      puVar6 = iVar10.pc_;
      ppVar7 = iVar10.p_ + 1;
      if (((uint)iVar10.pc_ & 0xf) == 0xe) break;
      iVar10.p_ = ppVar7;
      iVar10.pc_ = puVar6 + 1;
      puVar5 = puVar5 + 1;
      puVar6 = puVar4 + 1;
      if (puVar4[-1] != '\0') goto code_r0x00165c90;
    }
    auVar8[0] = -(*puVar4 == '\0');
    auVar8[1] = -(puVar4[1] == '\0');
    auVar8[2] = -(puVar4[2] == '\0');
    auVar8[3] = -(puVar4[3] == '\0');
    auVar8[4] = -(puVar4[4] == '\0');
    auVar8[5] = -(puVar4[5] == '\0');
    auVar8[6] = -(puVar4[6] == '\0');
    auVar8[7] = -(puVar4[7] == '\0');
    auVar8[8] = -(puVar4[8] == '\0');
    auVar8[9] = -(puVar4[9] == '\0');
    auVar8[10] = -(puVar4[10] == '\0');
    auVar8[0xb] = -(puVar4[0xb] == '\0');
    auVar8[0xc] = -(puVar4[0xc] == '\0');
    auVar8[0xd] = -(puVar4[0xd] == '\0');
    auVar8[0xe] = -(puVar4[0xe] == '\0');
    auVar8[0xf] = -(puVar4[0xf] == '\0');
    uVar3 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe;
    while (uVar3 == 0x7fff) {
      ppVar7 = ppVar7 + 0xf;
      auVar9[0] = -(*puVar5 == '\0');
      auVar9[1] = -(puVar5[1] == '\0');
      auVar9[2] = -(puVar5[2] == '\0');
      auVar9[3] = -(puVar5[3] == '\0');
      auVar9[4] = -(puVar5[4] == '\0');
      auVar9[5] = -(puVar5[5] == '\0');
      auVar9[6] = -(puVar5[6] == '\0');
      auVar9[7] = -(puVar5[7] == '\0');
      auVar9[8] = -(puVar5[8] == '\0');
      auVar9[9] = -(puVar5[9] == '\0');
      auVar9[10] = -(puVar5[10] == '\0');
      auVar9[0xb] = -(puVar5[0xb] == '\0');
      auVar9[0xc] = -(puVar5[0xc] == '\0');
      auVar9[0xd] = -(puVar5[0xd] == '\0');
      auVar9[0xe] = -(puVar5[0xe] == '\0');
      auVar9[0xf] = -(puVar5[0xf] == '\0');
      puVar4 = puVar5;
      puVar5 = puVar5 + 0x10;
      uVar3 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe;
    }
    uVar2 = 0;
    if ((uVar3 ^ 0x7fff) != 0) {
      for (; ((uVar3 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    if (puVar4[uVar2] == '\x01') {
      return;
    }
    iVar10.p_ = ppVar7 + uVar2;
    iVar10.pc_ = puVar4 + uVar2;
  } while( true );
code_r0x00165c90:
  if (puVar4[-1] == '\x01') {
    return;
  }
  iVar10.pc_ = puVar4 + -1;
  goto LAB_00165c51;
}

Assistant:

void checkForInvalidNestedConfigNodes(const ASTContext& context,
                                      const ConfigBlockSymbol::InstanceOverride& node,
                                      const ConfigBlockSymbol& configBlock) {
    if (node.rule) {
        // Mark the rule as used so we don't also get a warning
        // about this rule when we're going to give a hard error anyway.
        node.rule->isUsed = true;

        auto& diag = context.addDiag(diag::ConfigInstanceUnderOtherConfig,
                                     node.rule->syntax->sourceRange());
        diag.addNote(diag::NoteConfigRule, configBlock.getTopCells()[0].sourceRange);
    }

    for (auto& [_, child] : node.childNodes)
        checkForInvalidNestedConfigNodes(context, child, configBlock);
}